

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regiongraph.cpp
# Opt level: O0

void __thiscall
libDAI::RegionGraph::RegionGraph
          (RegionGraph *this,FactorGraph *fg,
          vector<libDAI::Region,_std::allocator<libDAI::Region>_> *ors,
          vector<libDAI::Region,_std::allocator<libDAI::Region>_> *irs,
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          *edges)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  FRegion *this_00;
  value_type *__x;
  vector<libDAI::Region,_std::allocator<libDAI::Region>_> *in_RCX;
  vector<libDAI::Region,_std::allocator<libDAI::Region>_> *in_RDX;
  GraphicalModel *in_RDI;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *in_R8;
  const_iterator e;
  const_iterator beta;
  size_t alpha_1;
  size_t I;
  const_iterator alpha;
  value_type *in_stack_fffffffffffffe48;
  RegionGraph *in_stack_fffffffffffffe50;
  Factor *in_stack_fffffffffffffe58;
  FRegion *in_stack_fffffffffffffe60;
  FactorGraph *in_stack_fffffffffffffe68;
  FactorGraph *in_stack_fffffffffffffe70;
  RegionGraph *pRVar4;
  mapped_type_conflict *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  VarSet *in_stack_fffffffffffffe88;
  RegionGraph *in_stack_fffffffffffffe90;
  RegionGraph *in_stack_fffffffffffffeb0;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_f8;
  Region *local_f0;
  Region *local_e8;
  __normal_iterator<const_libDAI::Region_*,_std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>_>
  local_e0;
  RegionGraph *local_d8;
  ulong local_d0;
  Region *local_c8;
  BipartiteGraph<libDAI::FRegion,_libDAI::Region> *in_stack_ffffffffffffffb0;
  __normal_iterator<const_libDAI::Region_*,_std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>_>
  local_40 [3];
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *local_28;
  vector<libDAI::Region,_std::allocator<libDAI::Region>_> *local_20;
  vector<libDAI::Region,_std::allocator<libDAI::Region>_> *local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  GraphicalModel::GraphicalModel(in_RDI);
  in_RDI->_vptr_GraphicalModel = (_func_int **)&PTR__RegionGraph_00d4d9e8;
  FactorGraph::FactorGraph(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  BipartiteGraph<libDAI::FRegion,_libDAI::Region>::BipartiteGraph
            ((BipartiteGraph<libDAI::FRegion,_libDAI::Region> *)in_stack_fffffffffffffe50);
  in_RDI[0x18]._vptr_GraphicalModel = (_func_int **)0x0;
  *(undefined8 *)&in_RDI[0x18]._normType = 0;
  in_RDI[0x19]._vptr_GraphicalModel = (_func_int **)0x0;
  *(undefined8 *)&in_RDI[0x19]._normType = 0;
  in_RDI[0x17]._vptr_GraphicalModel = (_func_int **)0x0;
  *(undefined8 *)&in_RDI[0x17]._normType = 0;
  in_RDI[0x18]._vptr_GraphicalModel = (_func_int **)0x0;
  *(undefined8 *)&in_RDI[0x18]._normType = 0;
  std::
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::map((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         *)0xb93119);
  ORs((RegionGraph *)0xb93126);
  std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::size(local_18);
  std::vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>::reserve
            ((vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_> *)in_stack_fffffffffffffe90,
             (size_type)in_stack_fffffffffffffe88);
  local_40[0]._M_current =
       (Region *)
       std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::begin
                 ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)
                  in_stack_fffffffffffffe48);
  while( true ) {
    std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::end
              ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)in_stack_fffffffffffffe48)
    ;
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_libDAI::Region_*,_std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>_>
                        *)in_stack_fffffffffffffe50,
                       (__normal_iterator<const_libDAI::Region_*,_std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>_>
                        *)in_stack_fffffffffffffe48);
    if (!bVar2) break;
    ORs((RegionGraph *)0xb931a4);
    __gnu_cxx::
    __normal_iterator<const_libDAI::Region_*,_std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>_>
    ::operator*(local_40);
    TFactor<double>::TFactor
              ((TFactor<double> *)in_stack_fffffffffffffe70,(VarSet *)in_stack_fffffffffffffe68,
               (Real)in_stack_fffffffffffffe60);
    FRegion::FRegion(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                     (double)in_stack_fffffffffffffe50);
    std::vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>::push_back
              ((vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_> *)
               in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    FRegion::~FRegion((FRegion *)0xb93218);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffe50);
    local_c8 = (Region *)
               __gnu_cxx::
               __normal_iterator<const_libDAI::Region_*,_std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>_>
               ::operator++((__normal_iterator<const_libDAI::Region_*,_std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>_>
                             *)in_stack_fffffffffffffe58,
                            (int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
  }
  local_d0 = 0;
  do {
    uVar1 = local_d0;
    sVar3 = FactorGraph::nrFactors((FactorGraph *)0xb932ff);
    if (sVar3 <= uVar1) {
      RecomputeORs(in_stack_fffffffffffffe90);
      IRs((RegionGraph *)0xb93467);
      std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::size(local_20);
      std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::reserve
                ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)
                 in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
      local_e0._M_current =
           (Region *)
           std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::begin
                     ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)
                      in_stack_fffffffffffffe48);
      while( true ) {
        local_e8 = (Region *)
                   std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::end
                             ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)
                              in_stack_fffffffffffffe48);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_libDAI::Region_*,_std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>_>
                            *)in_stack_fffffffffffffe50,
                           (__normal_iterator<const_libDAI::Region_*,_std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>_>
                            *)in_stack_fffffffffffffe48);
        if (!bVar2) break;
        in_stack_fffffffffffffe60 = (FRegion *)IRs((RegionGraph *)0xb934dc);
        __gnu_cxx::
        __normal_iterator<const_libDAI::Region_*,_std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>_>
        ::operator*(&local_e0);
        std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::push_back
                  ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)
                   in_stack_fffffffffffffe60,(value_type *)in_stack_fffffffffffffe58);
        local_f0 = (Region *)
                   __gnu_cxx::
                   __normal_iterator<const_libDAI::Region_*,_std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>_>
                   ::operator++((__normal_iterator<const_libDAI::Region_*,_std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>_>
                                 *)in_stack_fffffffffffffe58,
                                (int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
      }
      __x = (value_type *)Redges((RegionGraph *)0xb93527);
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::size(local_28);
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::reserve((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                (size_type)in_stack_fffffffffffffe78);
      local_f8._M_current =
           (pair<unsigned_long,_unsigned_long> *)
           std::
           vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ::begin((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffe48);
      while( true ) {
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::end((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)in_stack_fffffffffffffe48);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                            *)in_stack_fffffffffffffe50,
                           (__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                            *)in_stack_fffffffffffffe48);
        if (!bVar2) break;
        in_stack_fffffffffffffe50 = (RegionGraph *)Redges((RegionGraph *)0xb9359c);
        __gnu_cxx::
        __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
        ::operator*(&local_f8);
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::push_back((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     *)in_stack_fffffffffffffe60,__x);
        __gnu_cxx::
        __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
        ::operator++((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                      *)__x,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
      }
      BipartiteGraph<libDAI::FRegion,_libDAI::Region>::Regenerate(in_stack_ffffffffffffffb0);
      Check_Counting_Numbers(in_stack_fffffffffffffeb0);
      return;
    }
    local_d8 = (RegionGraph *)0x0;
    while( true ) {
      pRVar4 = local_d8;
      in_stack_fffffffffffffeb0 = (RegionGraph *)nr_ORs((RegionGraph *)0xb9333f);
      if (in_stack_fffffffffffffeb0 <= pRVar4) break;
      this_00 = OR(in_stack_fffffffffffffe50,(long)in_stack_fffffffffffffe48);
      TFactor<double>::vars(&this_00->super_Factor);
      in_stack_fffffffffffffe90 =
           (RegionGraph *)
           FactorGraph::factor((FactorGraph *)in_stack_fffffffffffffe50,
                               (size_t)in_stack_fffffffffffffe48);
      in_stack_fffffffffffffe88 =
           TFactor<double>::vars((TFactor<double> *)in_stack_fffffffffffffe90);
      in_stack_fffffffffffffe87 =
           VarSet::operator>>((VarSet *)in_stack_fffffffffffffe50,
                              (VarSet *)in_stack_fffffffffffffe48);
      if ((bool)in_stack_fffffffffffffe87) {
        pRVar4 = local_d8;
        in_stack_fffffffffffffe78 =
             std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                           *)in_stack_fffffffffffffe90,(key_type *)in_stack_fffffffffffffe88);
        *in_stack_fffffffffffffe78 = (mapped_type_conflict)pRVar4;
        break;
      }
      local_d8 = (RegionGraph *)((long)&(local_d8->super_GraphicalModel)._vptr_GraphicalModel + 1);
    }
    local_d0 = local_d0 + 1;
  } while( true );
}

Assistant:

RegionGraph::RegionGraph(const FactorGraph & fg, const std::vector<Region> & ors, const std::vector<Region> & irs, const std::vector<R_edge_t> & edges) : GraphicalModel(), _fg(fg), _rg(), _fac2OR() {
        // Copy outer regions (giving them counting number 1.0)
        ORs().reserve( ors.size() );
        for( vector<Region>::const_iterator alpha = ors.begin(); alpha != ors.end(); alpha++ )
            ORs().push_back( FRegion(Factor(*alpha, 1.0), 1.0) );

        // For each factor, find an outer regions that subsumes that factor.
        // Then, multiply the outer region with that factor.
        for( size_t I = 0; I < _fg.nrFactors(); I++ ) {
            size_t alpha;
            for( alpha = 0; alpha < nr_ORs(); alpha++ )
                if( OR(alpha).vars() >> _fg.factor(I).vars() ) {
                    _fac2OR[I] = alpha;
                    break;
                }
            assert( alpha != nr_ORs() );
        }
        RecomputeORs();
        
        // Copy inner regions
        IRs().reserve( irs.size() );
        for( vector<Region>::const_iterator beta = irs.begin(); beta != irs.end(); beta++ )
            IRs().push_back( *beta );
        
        // Copy edges
        Redges().reserve( edges.size() );
        for( vector<R_edge_t>::const_iterator e = edges.begin(); e != edges.end(); e++ )
            Redges().push_back( *e );
        
        // Regenerate BipartiteGraph internals
        _rg.Regenerate();

        // Check counting numbers
        Check_Counting_Numbers();
    }